

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O1

void __thiscall wasm::BinaryInstWriter::visitDataDrop(BinaryInstWriter *this,DataDrop *curr)

{
  BufferWithRandomAccess *pBVar1;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  LEB<unsigned_int,_unsigned_char> local_24;
  LEB<unsigned_int,_unsigned_char> local_20;
  uchar local_19;
  
  local_19 = 0xfc;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_19);
  local_20.value = 9;
  LEB<unsigned_int,_unsigned_char>::write(&local_20,(int)this->o,__buf,in_RCX);
  pBVar1 = this->o;
  local_24.value =
       WasmBinaryWriter::getDataSegmentIndex(this->parent,(Name)(curr->segment).super_IString.str);
  LEB<unsigned_int,_unsigned_char>::write(&local_24,(int)pBVar1,__buf_00,in_RCX);
  return;
}

Assistant:

void BinaryInstWriter::visitDataDrop(DataDrop* curr) {
  o << int8_t(BinaryConsts::MiscPrefix);
  o << U32LEB(BinaryConsts::DataDrop);
  o << U32LEB(parent.getDataSegmentIndex(curr->segment));
}